

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O3

void Gme_File::copy_field_(char *out,char *in,int in_size)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *__src;
  ulong uVar7;
  size_t __n;
  long lVar8;
  
  if (in == (char *)0x0) {
    return;
  }
  if (*in == '\0') {
    return;
  }
  __src = in;
  if (in_size == 0) {
LAB_006dda59:
    lVar6 = 0;
  }
  else {
    __src = in + (uint)in_size;
    lVar6 = 0;
    do {
      if (0x1f < (int)*in - 1U) {
        uVar4 = 0xff;
        if (in_size < 0xff) {
          uVar4 = in_size;
        }
        __src = in;
        if (in_size < 1) goto LAB_006dda59;
        uVar1 = 0xff;
        if (in_size < 0xff) {
          uVar1 = in_size;
        }
        uVar7 = 0;
        goto LAB_006dda49;
      }
      in = in + 1;
      in_size = in_size - 1;
    } while (in_size != 0);
  }
  goto LAB_006dda61;
  while (uVar7 = uVar7 + 1, uVar1 != uVar7) {
LAB_006dda49:
    if (in[uVar7] == '\0') {
      uVar4 = (uint)uVar7;
      break;
    }
  }
  lVar6 = (long)(int)uVar4;
LAB_006dda61:
  lVar3 = lVar6 << 0x20;
  do {
    lVar8 = lVar3;
    if (lVar6 == 0) break;
    lVar2 = lVar6 + -1;
    lVar6 = lVar6 + -1;
    lVar3 = lVar8 + -0x100000000;
  } while ((byte)__src[lVar2] < 0x21);
  __n = lVar8 >> 0x20;
  out[__n] = '\0';
  memcpy(out,__src,__n);
  if ((((*out == '?') && (out[1] == '\0')) || (iVar5 = strcmp(out,"<?>"), iVar5 == 0)) ||
     (iVar5 = strcmp(out,"< ? >"), iVar5 == 0)) {
    *out = '\0';
  }
  return;
}

Assistant:

void Gme_File::copy_field_( char* out, const char* in, int in_size )
{
	if ( !in || !*in )
		return;
	
	// remove spaces/junk from beginning
	while ( in_size && unsigned (*in - 1) <= ' ' - 1 )
	{
		in++;
		in_size--;
	}
	
	// truncate
	if ( in_size > max_field_ )
		in_size = max_field_;
	
	// find terminator
	int len = 0;
	while ( len < in_size && in [len] )
		len++;
	
	// remove spaces/junk from end
	while ( len && unsigned (in [len - 1]) <= ' ' )
		len--;
	
	// copy
	out [len] = 0;
	memcpy( out, in, len );
	
	// strip out stupid fields that should have been left blank
	if ( !strcmp( out, "?" ) || !strcmp( out, "<?>" ) || !strcmp( out, "< ? >" ) )
		out [0] = 0;
}